

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::PrepareCommittedResources
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CommittedShaderResources *Resources
          ,Uint32 *DvpCompatibleSRBCount)

{
  bool bVar1;
  Uint32 UVar2;
  Uint32 UVar3;
  PipelineStateVkImpl *pPVar4;
  PipelineResourceSignatureImplType *this_00;
  ShaderResourceBindingBase<Diligent::EngineVkImplTraits> *this_01;
  bool local_89;
  bool local_81;
  PipelineResourceSignatureImplType *local_80;
  uint local_60;
  int local_5c;
  Uint32 sign;
  PipelineResourceSignatureImplType *pSRBSign;
  PipelineResourceSignatureImplType *pPSOSign;
  RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> pSRB;
  PipelineResourceSignatureImplType *pSignature;
  Uint32 i;
  Uint32 SignCount;
  Uint32 *DvpCompatibleSRBCount_local;
  CommittedShaderResources *Resources_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
  UVar2 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                    (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  Resources->ActiveSRBMask = '\0';
  for (pSignature._0_4_ = 0; (Uint32)pSignature < UVar2; pSignature._0_4_ = (Uint32)pSignature + 1)
  {
    pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
    pSRB.m_pObject =
         (ShaderResourceBindingVkImpl *)
         PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                   (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                    (Uint32)pSignature);
    if (((PipelineResourceSignatureImplType *)pSRB.m_pObject !=
         (PipelineResourceSignatureImplType *)0x0) &&
       (UVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetTotalResourceCount
                          ((PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)
                           pSRB.m_pObject), UVar3 != 0)) {
      Resources->ActiveSRBMask =
           Resources->ActiveSRBMask | (byte)(1 << ((byte)(Uint32)pSignature & 0x1f));
    }
  }
  *DvpCompatibleSRBCount = 0;
  while (*DvpCompatibleSRBCount < UVar2) {
    std::array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>,_8UL>::operator[]
              (&Resources->SRBs,(ulong)*DvpCompatibleSRBCount);
    RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Lock
              ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)&pPSOSign);
    pPVar4 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(&this->m_pPipelineState);
    this_00 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                        (&pPVar4->super_PipelineStateBase<Diligent::EngineVkImplTraits>,
                         *DvpCompatibleSRBCount);
    bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&pPSOSign);
    if (bVar1) {
      this_01 = &RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::operator->
                           ((RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *)&pPSOSign)->
                 super_ShaderResourceBindingBase<Diligent::EngineVkImplTraits>;
      local_80 = ShaderResourceBindingBase<Diligent::EngineVkImplTraits>::GetSignature(this_01);
    }
    else {
      local_80 = (PipelineResourceSignatureImplType *)0x0;
    }
    local_81 = true;
    if (this_00 != (PipelineResourceSignatureImplType *)0x0) {
      UVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetTotalResourceCount
                        (&this_00->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                        );
      local_81 = UVar3 == 0;
    }
    local_89 = true;
    if (local_80 != (PipelineResourceSignatureImplType *)0x0) {
      UVar3 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetTotalResourceCount
                        (&local_80->
                          super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>);
      local_89 = UVar3 == 0;
    }
    if (local_81 == local_89) {
      if (((this_00 == (PipelineResourceSignatureImplType *)0x0) ||
          (local_80 == (PipelineResourceSignatureImplType *)0x0)) ||
         (bVar1 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::IsIncompatibleWith
                            (&this_00->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                             local_80), !bVar1)) {
        local_5c = 0;
      }
      else {
        local_5c = 5;
      }
    }
    else {
      local_5c = 5;
    }
    RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::ShaderResourceBindingVkImpl> *)&pPSOSign);
    if (local_5c != 0) break;
    *DvpCompatibleSRBCount = *DvpCompatibleSRBCount + 1;
  }
  for (local_60 = *DvpCompatibleSRBCount; local_60 < UVar2; local_60 = local_60 + 1) {
    CommittedShaderResources::Set(Resources,local_60,(ShaderResourceBindingImplType *)0x0);
  }
  Resources->ResourcesValidated = false;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::PrepareCommittedResources(CommittedShaderResources& Resources, Uint32& DvpCompatibleSRBCount)
{
    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();

    Resources.ActiveSRBMask = 0;
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        const PipelineResourceSignatureImplType* pSignature = m_pPipelineState->GetResourceSignature(i);
        if (pSignature == nullptr || pSignature->GetTotalResourceCount() == 0)
            continue;

        Resources.ActiveSRBMask |= 1u << i;
    }

    DvpCompatibleSRBCount = 0;

#ifdef DILIGENT_DEVELOPMENT
    // Layout compatibility means that descriptor sets can be bound to a command buffer
    // for use by any pipeline created with a compatible pipeline layout, and without having bound
    // a particular pipeline first. It also means that descriptor sets can remain valid across
    // a pipeline change, and the same resources will be accessible to the newly bound pipeline.
    // (14.2.2. Pipeline Layouts, clause 'Pipeline Layout Compatibility')
    // https://www.khronos.org/registry/vulkan/specs/1.2-extensions/html/vkspec.html#descriptorsets-compatibility

    // Find the number of SRBs compatible with signatures in the current pipeline
    for (; DvpCompatibleSRBCount < SignCount; ++DvpCompatibleSRBCount)
    {
        RefCntAutoPtr<ShaderResourceBindingImplType> pSRB = Resources.SRBs[DvpCompatibleSRBCount].Lock();

        const PipelineResourceSignatureImplType* pPSOSign = m_pPipelineState->GetResourceSignature(DvpCompatibleSRBCount);
        const PipelineResourceSignatureImplType* pSRBSign = pSRB ? pSRB->GetSignature() : nullptr;

        if ((pPSOSign == nullptr || pPSOSign->GetTotalResourceCount() == 0) !=
            (pSRBSign == nullptr || pSRBSign->GetTotalResourceCount() == 0))
        {
            // One signature is null or empty while the other is not - SRB is not compatible with the PSO.
            break;
        }

        if (pPSOSign != nullptr && pSRBSign != nullptr && pPSOSign->IsIncompatibleWith(*pSRBSign))
        {
            // Signatures are incompatible
            break;
        }
    }

    // Unbind incompatible shader resources
    // A consequence of layout compatibility is that when the implementation compiles a pipeline
    // layout and maps pipeline resources to implementation resources, the mechanism for set N
    // should only be a function of sets [0..N].
    for (Uint32 sign = DvpCompatibleSRBCount; sign < SignCount; ++sign)
    {
        Resources.Set(sign, nullptr);
    }

    Resources.ResourcesValidated = false;
#endif
}